

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argv_parser.cc
# Opt level: O3

char * string2chars(string *str)

{
  size_t __n;
  ulong uVar1;
  char *__dest;
  ulong uVar2;
  
  __n = str->_M_string_length;
  uVar1 = (long)((__n << 0x20) + 0x100000000) >> 0x20;
  uVar2 = 0xffffffffffffffff;
  if (-1 < (long)uVar1) {
    uVar2 = uVar1;
  }
  __dest = (char *)operator_new__(uVar2);
  if (__n != 0) {
    memcpy(__dest,(str->_M_dataplus)._M_p,__n);
  }
  __dest[(long)(__n << 0x20) >> 0x20] = '\0';
  return __dest;
}

Assistant:

char *string2chars(const string &str) {
    int len = str.length();
    auto *chars = new char[len + 1];
    for (int i = 0; i < str.length(); i++) {
        chars[i] = str[i];
    }
    chars[len] = 0;
    return chars;
}